

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

int __thiscall
clunk::Node::Search<(clunk::NodeType)1,true>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  HashEntry *this_00;
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  Move MVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int beta_00;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  Move *pMVar13;
  char cVar14;
  uint uVar15;
  Move *pMVar16;
  Move *pMVar17;
  Node *pNVar18;
  Move *pMVar19;
  Move *pMVar20;
  uint uVar21;
  Move firstMove;
  int local_84;
  uint local_7c;
  
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  uVar12 = -alpha;
  if (0 < alpha) {
    uVar12 = alpha;
  }
  if (32000 < uVar12) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  uVar12 = -beta;
  if (0 < beta) {
    uVar12 = beta;
  }
  if (32000 < uVar12) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (alpha + 1 != beta) {
    __assert_fail("(type == PV) | ((alpha + 1) == beta)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf73,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if ((cutNode) && (bVar5 = Move::IsValid(&this->lastMove), !bVar5)) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  _stats._48_8_ = _stats._48_8_ + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->depthChange = 0;
  this->pvCount = 0;
  if ((99 < this->rcount || (this->state & 0x20U) != 0) || (bVar5 = HasRepeated(this), bVar5)) {
    iVar6 = DAT_0017da54;
    this->standPat = DAT_0017da54;
    return iVar6;
  }
  iVar6 = this->ply;
  uVar12 = iVar6 - 32000;
  if (alpha < (int)uVar12) {
    alpha = uVar12;
  }
  uVar21 = 0x7d01U - iVar6;
  if (beta <= (int)(0x7d01U - iVar6)) {
    uVar21 = beta;
  }
  if (this->child == (Node *)0x0 || (int)uVar21 <= alpha) {
    return alpha;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    _stats._64_8_ = _stats._64_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  firstMove.bits = 0;
  firstMove.score = 0;
  if (_tt._32_8_ == 0) {
    __assert_fail("keyMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf7,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  if (_tt._40_8_ == 0) {
    __assert_fail("entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf8,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  _tt._0_8_ = _tt._0_8_ + 1;
  lVar9 = (_tt._32_8_ & this->positionKey) * 0x10;
  this_00 = (HashEntry *)(_tt._40_8_ + lVar9);
  if (*(ulong *)(_tt._40_8_ + lVar9) == this->positionKey) {
    _tt._8_8_ = _tt._8_8_ + 1;
    switch(this_00->flags & 7) {
    case 1:
      goto switchD_00134110_caseD_1;
    case 2:
      goto switchD_00134110_caseD_2;
    case 3:
      uVar1 = this_00->moveBits;
      iVar6 = HashEntry::Score(this_00,iVar6);
      Move::Init(&firstMove,uVar1,iVar6);
      iVar6 = ValidateMove<true>(this,&firstMove);
      if (iVar6 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      iVar11 = firstMove.score;
      if (firstMove.score <= alpha && (uint)depth <= (uint)this_00->depth) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        return firstMove.score;
      }
      break;
    case 4:
      uVar1 = this_00->moveBits;
      iVar6 = HashEntry::Score(this_00,iVar6);
      Move::Init(&firstMove,uVar1,iVar6);
      iVar6 = ValidateMove<true>(this,&firstMove);
      if (iVar6 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      if ((this_00->flags & 0x10) == 0) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      if ((uint)depth <= (uint)this_00->depth) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        if (firstMove.score < (int)uVar21) {
          if ((alpha < firstMove.score) &&
             ((((ulong)firstMove & 0xff00000) == 0 && this->checks == 0) &&
              (firstMove.bits & 0xf) != 3)) {
            IncHistory(&firstMove,depth);
          }
        }
        else {
          AddKiller(this,&firstMove,depth);
        }
        return firstMove.score;
      }
      iVar11 = firstMove.score;
      break;
    case 5:
      uVar1 = this_00->moveBits;
      iVar6 = HashEntry::Score(this_00,iVar6);
      Move::Init(&firstMove,uVar1,iVar6);
      iVar6 = ValidateMove<true>(this,&firstMove);
      if (iVar6 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      iVar11 = 32000;
      if (((uint)depth <= (uint)this_00->depth) && ((int)uVar21 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        AddKiller(this,&firstMove,depth);
        return firstMove.score;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    iVar6 = this->depthChange;
    if (((iVar6 < 1) && (this->parent->depthChange < 1)) && ((this_00->flags & 8) != 0)) {
      _stats._80_8_ = _stats._80_8_ + 1;
      iVar6 = iVar6 + 1;
      this->depthChange = iVar6;
      depth = depth + 1;
    }
  }
  else {
    iVar6 = this->depthChange;
    iVar11 = 32000;
  }
  if (iVar6 < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if ((((iVar6 == 0 && this->checks == 0) && cutNode) &&
      (uVar1 = (this->lastMove).bits, uVar1 != this->killer[0].bits)) &&
     ((uVar1 != this->killer[1].bits &&
      ((1 < DAT_001688f4 + DAT_001688e4 && (2 < DAT_001688f4 + DAT_001688e4 + DAT_001688ec)))))) {
    if (alpha + 1U != uVar21) {
      __assert_fail("(alpha + 1) == beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfe0,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    Evaluate(this);
    if (this->standPat < iVar11) {
      iVar11 = this->standPat;
    }
    if (depth == 1) {
      uVar12 = -uVar21;
      if (0 < (int)uVar21) {
        uVar12 = uVar21;
      }
      if ((uVar12 < 20000) && ((int)(uVar21 + 300) <= iVar11)) {
        _stats._112_8_ = _stats._112_8_ + 1;
        this->depthChange = -1;
        return uVar21;
      }
    }
    else if ((int)uVar21 <= iVar11) {
      ExecNullMove<true>(this,this->child);
      iVar6 = ((depth - (uint)depth / 6) - (uint)((int)uVar21 <= iVar11 + -500)) + -3;
      if (iVar6 < 1) {
        iVar6 = QSearch<false>(this->child,-uVar21,-alpha,0);
      }
      else {
        iVar6 = Search<(clunk::NodeType)1,false>(this->child,-uVar21,-alpha,iVar6,false);
      }
      if (_stop != 0) {
        return uVar21;
      }
      if (uVar21 == -iVar6 || SBORROW4(uVar21,-iVar6) != (int)(uVar21 + iVar6) < 0) {
        _stats._160_8_ = _stats._160_8_ + 1;
        this->depthChange = -depth;
        if (this->standPat <= (int)uVar21) {
          return uVar21;
        }
        return this->standPat;
      }
    }
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfff,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1000,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if ((uint)depth < 4 || ((ulong)firstMove & 0xf) != 0) {
    if (((ulong)firstMove & 0xf) == 0) {
      if (this->pvCount != 0) {
        __assert_fail("!pvCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1015,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      GenerateMoves<true,false>(this,depth);
      uVar12 = this->moveCount;
      if ((int)uVar12 < 1) {
        if (this->checks != 0) {
          HashEntry::SetCheckmate(this_00,this->positionKey);
          _tt._16_8_ = _tt._16_8_ + 1;
          return this->ply + -32000;
        }
        HashEntry::SetStalemate(this_00,this->positionKey);
        _tt._24_8_ = _tt._24_8_ + 1;
switchD_00134110_caseD_2:
        iVar6 = DAT_0017da54;
        this->standPat = DAT_0017da54;
        return iVar6;
      }
      uVar7 = this->moveIndex;
      if ((int)uVar7 < 0) {
LAB_00134e82:
        __assert_fail("moveIndex >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x914,"Move *clunk::Node::GetNextMove()");
      }
      if (0x7f < uVar12) {
LAB_00134ea1:
        __assert_fail("(moveCount >= 0) & (moveCount < MaxMoves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x915,"Move *clunk::Node::GetNextMove()");
      }
      pMVar16 = this->moves + uVar7;
      uVar15 = uVar7 + 1;
      if (uVar15 < uVar12) {
        pMVar13 = this->moves + (ulong)uVar7 + 1;
        pMVar20 = pMVar16;
        uVar7 = uVar15;
        do {
          pMVar19 = pMVar13;
          if (pMVar13->score <= pMVar20->score) {
            pMVar19 = pMVar20;
          }
          uVar7 = uVar7 + 1;
          pMVar13 = pMVar13 + 1;
          pMVar20 = pMVar19;
        } while ((int)uVar7 < (int)uVar12);
        if (pMVar19 != pMVar16) {
          MVar4 = *pMVar16;
          *pMVar16 = *pMVar19;
          *pMVar19 = MVar4;
        }
      }
      this->moveIndex = uVar15;
      Move::operator=(&firstMove,pMVar16);
      if (this->moveIndex != 1) {
        __assert_fail("moveIndex == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1023,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
    }
  }
  else {
    if (this->pvCount != 0) {
      __assert_fail("!pvCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x1005,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    _stats._144_8_ = _stats._144_8_ + 1;
    iVar6 = Search<(clunk::NodeType)1,true>(this,uVar21 - 1,uVar21,depth - 2,false);
    if (this->pvCount == 0 || _stop != 0) {
      return iVar6;
    }
    if (this->moveCount < 1) {
      __assert_fail("moveCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100b,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    if (this->pvCount < 1) {
      __assert_fail("pvCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100c,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    bVar5 = Move::IsValid(this->pv);
    if (!bVar5) {
      __assert_fail("pv[0].IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100d,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    Move::operator=(&firstMove,this->pv);
    this->moveIndex = 1;
  }
  if (((this->moveCount == 1) && (this->depthChange < 1)) && (this->parent->depthChange < 1)) {
    _stats._72_8_ = _stats._72_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  Exec<true>(this,&firstMove,this->child);
  iVar6 = -uVar21;
  if (depth < 2) {
    uVar7 = QSearch<false>(this->child,iVar6,-alpha,0);
  }
  else {
    uVar7 = Search<(clunk::NodeType)1,false>(this->child,iVar6,-alpha,depth - 1,!cutNode);
  }
  Undo<true>(this,&firstMove);
  uVar12 = uVar21;
  if (_stop == 0) {
    uVar15 = this->child->depthChange;
    pMVar16 = this->pv;
    Move::operator=(pMVar16,&firstMove);
    pNVar18 = this->child;
    if (pNVar18 == (Node *)0x0) {
      this->pvCount = 1;
    }
    else {
      uVar12 = pNVar18->pvCount;
      this->pvCount = uVar12 + 1;
      if (0 < (int)uVar12) {
        if (99 < uVar12) {
LAB_001351c7:
          __assert_fail("pvCount <= MaxPlies",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xc50,"void clunk::Node::UpdatePV(const Move &)");
        }
        memcpy(this->pv + 1,pNVar18->pv,(long)pNVar18->pvCount << 3);
      }
    }
    uVar12 = -uVar7;
    local_7c = ((int)uVar15 >> 0x1f & uVar15) + depth;
    if (uVar21 != uVar12 && SBORROW4(uVar21,uVar12) == (int)(uVar21 + uVar7) < 0) {
      if (SBORROW4(alpha,uVar12) == (int)(alpha + uVar7) < 0) {
        uVar7 = alpha;
        if (((firstMove.bits & 0xf) != 3 && ((ulong)firstMove & 0xff00000) == 0) &&
            this->checks == 0) {
          cVar14 = -1;
          if (-1 < (char)_hist[firstMove.bits & 0xfff]) {
            cVar14 = _hist[firstMove.bits & 0xfff];
          }
          _hist[firstMove.bits & 0xfff] = cVar14 + -1;
        }
      }
      else {
        uVar7 = uVar12;
        if ((int)uVar15 < 0) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1044,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
      }
      if (this->moveCount < 1) {
        GenerateMoves<true,false>(this,depth);
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104e,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        if ((this->moveCount == 1) && (this->moves[0].bits != firstMove.bits)) {
          __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104f,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
      }
      if (1 < this->moveIndex) {
        __assert_fail("moveIndex <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1052,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      iVar2 = this->checks;
      iVar11 = depth - 1;
      do {
        beta_00 = -uVar7;
LAB_00134880:
        do {
          uVar15 = this->moveIndex;
          if ((int)uVar15 < 0) goto LAB_00134e82;
          uVar3 = this->moveCount;
          if (0x7f < uVar3) goto LAB_00134ea1;
          if (uVar3 <= uVar15) {
            if (uVar3 == 0) {
              __assert_fail("moveCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a3,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            if ((int)uVar7 < (int)uVar12) {
              __assert_fail("best <= alpha",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a4,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            if ((int)uVar21 <= (int)uVar7) {
              __assert_fail("alpha < beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a5,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            if (this->pvCount < 1) {
              return uVar12;
            }
            if ((int)local_7c < 0) {
              __assert_fail("pvDepth >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a8,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            bVar5 = Move::IsValid(pMVar16);
            if (bVar5) {
              uVar21 = this->pv[0].bits;
              if (((uVar21 & 0xf) != 3 && (uVar21 & 0xff00000) == 0) && this->checks == 0) {
                IncHistory(pMVar16,depth);
              }
              if ((int)uVar12 <= alpha) {
                if (uVar7 == alpha) {
                  HashEntry::Set(this_00,this->positionKey,pMVar16,alpha,this->ply,local_7c,3,
                                 (uint)(0 < this->depthChange) << 3);
                  return uVar12;
                }
                __assert_fail("alpha == orig_alpha",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10b6,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                             );
              }
              __assert_fail("pvNode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10ae,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            __assert_fail("pv[0].IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10a9,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          pMVar20 = this->moves + uVar15;
          uVar10 = uVar15 + 1;
          if (uVar10 < uVar3) {
            pMVar13 = this->moves + (ulong)uVar15 + 1;
            pMVar19 = pMVar20;
            uVar15 = uVar10;
            do {
              pMVar17 = pMVar13;
              if (pMVar13->score <= pMVar19->score) {
                pMVar17 = pMVar19;
              }
              uVar15 = uVar15 + 1;
              pMVar13 = pMVar13 + 1;
              pMVar19 = pMVar17;
            } while ((int)uVar15 < (int)uVar3);
            if (pMVar17 != pMVar20) {
              MVar4 = *pMVar20;
              *pMVar20 = *pMVar17;
              *pMVar17 = MVar4;
            }
          }
          this->moveIndex = uVar10;
          bVar5 = Move::IsValid(pMVar20);
          if (!bVar5) {
            __assert_fail("move->IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1059,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
        } while (firstMove.bits == pMVar20->bits);
        _stats._192_8_ = _stats._192_8_ + 1;
        Exec<true>(this,pMVar20,this->child);
        pNVar18 = this->child;
        local_84 = iVar11;
        if (iVar2 == 0 && 2 < depth) {
          _stats._200_8_ = _stats._200_8_ + 1;
          uVar15 = pMVar20->bits;
          if ((((uVar15 != this->killer[1].bits && uVar15 != this->killer[0].bits) &&
               ((uVar15 & 0xf) != 3 && (uVar15 & 0xff00000) == 0)) && pNVar18->checks == 0) &&
             ((char)_hist[uVar15 & 0xfff] < depth)) {
            _stats._208_8_ = _stats._208_8_ + 1;
            local_84 = ~(uint)((byte)_hist[uVar15 & 0xfff] >> 7) + iVar11;
            goto LAB_001349bf;
          }
LAB_001349c4:
          iVar8 = Search<(clunk::NodeType)1,false>(pNVar18,~uVar7,beta_00,local_84,true);
        }
        else {
LAB_001349bf:
          if (0 < local_84) goto LAB_001349c4;
          iVar8 = QSearch<false>(pNVar18,~uVar7,beta_00,0);
        }
        uVar15 = -iVar8;
        pNVar18 = this->child;
        if ((SBORROW4(uVar7,uVar15) != (int)(uVar7 + iVar8) < 0) && (_stop == 0)) {
          if (pNVar18->depthChange < 0) {
            __assert_fail("child->depthChange >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1074,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          _stats._232_8_ = _stats._232_8_ + 1;
          if (local_84 < iVar11) {
            if (uVar7 + 1 != uVar21) {
              __assert_fail("(alpha + 1) == beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x107e,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            _stats._216_8_ = _stats._216_8_ + 1;
            iVar8 = Search<(clunk::NodeType)1,false>(pNVar18,iVar6,beta_00,iVar11,false);
            uVar15 = -iVar8;
            pNVar18 = this->child;
          }
          _stats._224_8_ = _stats._224_8_ + (ulong)((int)uVar7 < (int)uVar15);
        }
        if (pNVar18->depthChange <= ~depth) {
          __assert_fail("(depth + child->depthChange) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1086,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        Undo<true>(this,pMVar20);
        if (_stop != 0) {
          return uVar21;
        }
        if ((int)uVar12 < (int)uVar15) {
          uVar3 = this->child->depthChange;
          Move::operator=(pMVar16,pMVar20);
          pNVar18 = this->child;
          if (pNVar18 == (Node *)0x0) {
            this->pvCount = 1;
          }
          else {
            uVar12 = pNVar18->pvCount;
            this->pvCount = uVar12 + 1;
            if (0 < (int)uVar12) {
              if (99 < uVar12) goto LAB_001351c7;
              memcpy(this->pv + 1,pNVar18->pv,(long)pNVar18->pvCount << 3);
            }
          }
          local_7c = ((int)uVar3 >> 0x1f & uVar3) + depth;
          uVar12 = uVar15;
          if ((int)uVar21 <= (int)uVar15) {
            if (-1 < (int)uVar3) {
              AddKiller(this,pMVar20,local_7c);
              uVar12 = -uVar15;
              if (0 < (int)uVar15) {
                uVar12 = uVar15;
              }
              if (31000 < uVar12) {
                uVar21 = uVar15;
              }
              HashEntry::Set(this_00,this->positionKey,pMVar20,uVar21,this->ply,local_7c,5,
                             (uint)(0 < this->depthChange) << 3);
              return uVar15;
            }
            __assert_fail("pvDepth == depth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1090,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
        }
        if ((int)uVar15 <= (int)uVar7) {
          uVar15 = pMVar20->bits;
          if (((uVar15 & 0xf) != 3 && (uVar15 & 0xff00000) == 0) && this->checks == 0) {
            cVar14 = _hist[uVar15 & 0xfff];
            if ((char)_hist[uVar15 & 0xfff] < '\0') {
              cVar14 = -1;
            }
            _hist[uVar15 & 0xfff] = cVar14 + -1;
          }
          goto LAB_00134880;
        }
        uVar7 = uVar15;
        if (local_7c != depth) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x109b,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
      } while( true );
    }
    if ((int)uVar15 < 0) {
      __assert_fail("pvDepth == depth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x103a,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    AddKiller(this,&firstMove,local_7c);
    uVar15 = -uVar7;
    if (0 < (int)uVar7) {
      uVar15 = uVar7;
    }
    if (31000 < uVar15) {
      uVar21 = uVar12;
    }
    HashEntry::Set(this_00,this->positionKey,&firstMove,uVar21,this->ply,local_7c,5,
                   (uint)(0 < this->depthChange) << 3);
  }
switchD_00134110_caseD_1:
  return uVar12;
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }